

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

bool ImFontAtlas_IsBuilt(ImFontAtlas *self)

{
  if ((self->Fonts).Size < 1) {
    return false;
  }
  if (self->TexPixelsAlpha8 != (uchar *)0x0) {
    return true;
  }
  return self->TexPixelsRGBA32 != (uint *)0x0;
}

Assistant:

bool                        IsBuilt()                   { return Fonts.Size > 0 && (TexPixelsAlpha8 != NULL || TexPixelsRGBA32 != NULL); }